

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O3

Gia_Man_t * Gia_ManRebuild(Gia_Man_t *p,Dsd_Manager_t *pManDsd,DdManager *ddNew)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Vec_Int_t *vFanins;
  int *piVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  Vec_Str_t *pVVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Dsd_Node_t *pDVar10;
  Gia_Obj_t *pGVar11;
  Dsd_Node_t **__ptr;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  int nNodesDsd;
  int local_4c;
  Vec_Str_t *local_48;
  Vec_Str_t *local_40;
  DdManager *local_38;
  
  local_38 = ddNew;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 1000;
  vFanins->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vFanins->pArray = piVar4;
  pVVar5 = (Vec_Str_t *)malloc(0x10);
  pVVar5->nCap = 10000;
  pVVar5->nSize = 0;
  pcVar6 = (char *)malloc(10000);
  pVVar5->pArray = pcVar6;
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  pcVar6 = (char *)malloc(1000);
  pVVar7->pArray = pcVar6;
  local_40 = pVVar7;
  p_00 = Gia_ManStart(p->nObjs * 2);
  pcVar6 = p->pName;
  if (pcVar6 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar6);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar6);
  }
  p_00->pName = pcVar9;
  pcVar6 = p->pSpec;
  local_48 = pVVar5;
  if (pcVar6 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar6);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar6);
  }
  p_00->pSpec = pcVar9;
  Gia_ManHashAlloc(p_00);
  pDVar10 = Dsd_ManagerReadConst1(pManDsd);
  Dsd_NodeSetMark(pDVar10,1);
  if (0 < p->vCis->nSize) {
    iVar13 = 0;
    do {
      pDVar10 = Dsd_ManagerReadInput(pManDsd,iVar13);
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar1 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar11 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar11)) goto LAB_0071a613;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar11 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar11)) goto LAB_0071a613;
      Dsd_NodeSetMark(pDVar10,(int)((ulong)((long)pGVar11 - (long)pGVar2) >> 2) * 0x55555556);
      iVar13 = iVar13 + 1;
    } while (iVar13 < p->vCis->nSize);
  }
  __ptr = Dsd_TreeCollectNodesDfs(pManDsd,&local_4c);
  pVVar7 = local_40;
  pVVar5 = local_48;
  if (local_4c < 1) {
    bVar17 = true;
    if (__ptr == (Dsd_Node_t **)0x0) goto LAB_0071a3f6;
  }
  else {
    lVar16 = 0;
    do {
      iVar13 = Gia_ManRebuildNode(pManDsd,__ptr[lVar16],p_00,local_38,vFanins,pVVar5,pVVar7);
      bVar17 = iVar13 == -1;
      if (bVar17) break;
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_4c);
  }
  free(__ptr);
LAB_0071a3f6:
  if (vFanins->pArray != (int *)0x0) {
    free(vFanins->pArray);
  }
  free(vFanins);
  if (pVVar5->pArray != (char *)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  if (pVVar7->pArray != (char *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if (bVar17) {
    Gia_ManStop(p_00);
    p_00 = Gia_ManDup(p);
  }
  else {
    if (0 < p->vCos->nSize) {
      iVar13 = 0;
      do {
        pDVar10 = Dsd_ManagerReadRoot(pManDsd,iVar13);
        uVar3 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar10 & 0xfffffffffffffffe));
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar15 = uVar3 >> 1;
        if (p_00->nObjs <= (int)uVar15) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(p_00->pObjs + uVar15) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p_00->pObjs + uVar15) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar1 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar1 | 0x80000000;
        pGVar2 = p_00->pObjs;
        if ((pGVar11 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar11)) {
LAB_0071a613:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar12 = (ulong)(((uint)((int)pGVar11 - (int)pGVar2) >> 2) * -0x55555555 - uVar15 &
                        0x1fffffff);
        uVar14 = (ulong)(((uVar3 ^ (uint)pDVar10) & 1) << 0x1d);
        *(ulong *)pGVar11 = uVar14 | uVar1 & 0xffffffffc0000000 | 0x80000000 | uVar12;
        *(ulong *)pGVar11 =
             uVar14 | uVar1 & 0xe0000000c0000000 | 0x80000000 | uVar12 |
             (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_00->pObjs;
        if ((pGVar11 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar11)) goto LAB_0071a613;
        Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar2) >> 2) * -0x55555555);
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),
                           pGVar11);
        }
        if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_0071a613;
        iVar13 = iVar13 + 1;
      } while (iVar13 < p->vCos->nSize);
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManRebuild( Gia_Man_t * p, Dsd_Manager_t * pManDsd, DdManager * ddNew )
{
    Gia_Man_t * pNew;
    Dsd_Node_t ** ppNodesDsd;
    Dsd_Node_t * pNodeDsd;
    int i, nNodesDsd, iLit = -1;
    Vec_Str_t * vSop, * vCube;
    Vec_Int_t * vFanins;

    vFanins = Vec_IntAlloc( 1000 );
    vSop    = Vec_StrAlloc( 10000 );
    vCube   = Vec_StrAlloc( 1000 );

    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );

    // save the CI nodes in the DSD nodes
    Dsd_NodeSetMark( Dsd_ManagerReadConst1(pManDsd), 1 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadInput( pManDsd, i );
        Dsd_NodeSetMark( pNodeDsd, Gia_ManAppendCi( pNew ) );
    }

    // collect DSD nodes in DFS order (leaves and const1 are not collected)
    ppNodesDsd = Dsd_TreeCollectNodesDfs( pManDsd, &nNodesDsd );
    for ( i = 0; i < nNodesDsd; i++ )
    {
        iLit = Gia_ManRebuildNode( pManDsd, ppNodesDsd[i], pNew, ddNew, vFanins, vSop, vCube );
        if ( iLit == -1 )
            break;
    }
    ABC_FREE( ppNodesDsd );
    Vec_IntFree( vFanins );
    Vec_StrFree( vSop );
    Vec_StrFree( vCube );
    if ( iLit == -1 )
    {
        Gia_ManStop( pNew );
        return Gia_ManDup(p);
    }

    // set the pointers to the CO drivers
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadRoot( pManDsd, i );
        iLit = Dsd_NodeReadMark( Dsd_Regular(pNodeDsd) );
        iLit = Abc_LitNotCond( iLit, Dsd_IsComplement(pNodeDsd) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}